

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::verifyImage
          (SamplePosDistributionCase *this,Surface *resultImage)

{
  bool bVar1;
  RenderTarget *this_00;
  TestLog *pTVar2;
  QualityWarning *this_01;
  int local_8c;
  allocator<char> local_69;
  string local_68;
  Verifier local_48;
  undefined1 local_40 [8];
  SampleAverageVerifier verifier;
  int sampleCount;
  Surface *resultImage_local;
  SamplePosDistributionCase *this_local;
  
  if ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_renderTarget ==
      TARGET_DEFAULT) {
    this_00 = gles31::Context::getRenderTarget
                        ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                         super_TestCase.m_context);
    local_8c = tcu::RenderTarget::getNumSamples(this_00);
  }
  else {
    local_8c = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numRequestedSamples
    ;
  }
  verifier._20_4_ = local_8c;
  SampleAverageVerifier::SampleAverageVerifier((SampleAverageVerifier *)local_40,local_8c);
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  NoRedVerifier::NoRedVerifier((NoRedVerifier *)&local_48);
  bVar1 = verifyImageWithVerifier(resultImage,pTVar2,&local_48,true);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((verifier.super_Verifier._vptr_Verifier._4_1_ & 1) != 0) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                          super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      bVar1 = verifyImageWithVerifier(resultImage,pTVar2,(Verifier *)local_40,true);
      if (!bVar1) {
        this_01 = (QualityWarning *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,
                   "Bias detected, sample positions are not uniformly distributed within the pixel",
                   &local_69);
        MultisampleShaderRenderUtil::QualityWarning::QualityWarning(this_01,&local_68);
        __cxa_throw(this_01,&MultisampleShaderRenderUtil::QualityWarning::typeinfo,
                    MultisampleShaderRenderUtil::QualityWarning::~QualityWarning);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SamplePosDistributionCase::verifyImage (const tcu::Surface& resultImage)
{
	const int				sampleCount	= (m_renderTarget == TARGET_DEFAULT) ? (m_context.getRenderTarget().getNumSamples()) : (m_numRequestedSamples);
	SampleAverageVerifier	verifier	(sampleCount);

	// check there is nothing in the error channel
	if (!verifyImageWithVerifier(resultImage, m_testCtx.getLog(), NoRedVerifier()))
		return false;

	// position average should be around 0.5, 0.5
	if (verifier.m_isStatisticallySignificant && !verifyImageWithVerifier(resultImage, m_testCtx.getLog(), verifier))
		throw MultisampleShaderRenderUtil::QualityWarning("Bias detected, sample positions are not uniformly distributed within the pixel");

	return true;
}